

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  ImVec4 *pIVar1;
  long lVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  ImDrawVert *pIVar5;
  ImGuiContext *pIVar6;
  ImDrawList *this;
  bool bVar7;
  bool bVar8;
  char cVar9;
  uint uVar10;
  ImGuiWindow *window_1;
  ImDrawCmd *pIVar11;
  char *pcVar12;
  long lVar13;
  char *pcVar14;
  unsigned_short *puVar15;
  int iVar16;
  ulong uVar17;
  ImDrawCmd *pIVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  ImGuiListClipper clipper;
  ImVec2 triangles_pos [3];
  char buf [300];
  undefined1 local_1d8 [12];
  float fStack_1cc;
  uint uStack_1c8;
  uint local_1c4;
  int local_1bc;
  ulong local_1b8;
  ImDrawList *local_1b0;
  uint local_1a4;
  ImDrawCmd *local_1a0;
  ImGuiContext *local_198;
  ImVec2 local_190;
  ImVec2 local_188 [4];
  undefined1 local_168 [12];
  float fStack_15c;
  undefined1 local_3c [12];
  
  pcVar12 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar12 = draw_list->_OwnerName;
  }
  bVar7 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds","DrawList",pcVar12,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,(draw_list->CmdBuffer).Size);
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  if (pIVar4->DrawList == draw_list) {
    if (pIVar4->SkipItems == false) {
      (pIVar4->DC).CursorPos.x = (pIVar6->Style).ItemSpacing.x + (pIVar4->DC).CursorPosPrevLine.x;
      (pIVar4->DC).CursorPos.y = (pIVar4->DC).CursorPosPrevLine.y;
      (pIVar4->DC).CurrentLineSize = (pIVar4->DC).PrevLineSize;
      (pIVar4->DC).CurrentLineTextBaseOffset = (pIVar4->DC).PrevLineTextBaseOffset;
    }
    local_168._0_4_ = 1.0;
    local_168._4_4_ = 0.4;
    local_168._8_4_ = 0.4;
    fStack_15c = 1.0;
    TextColored((ImVec4 *)local_168,"CURRENTLY APPENDING");
    if (!bVar7) {
      return;
    }
  }
  else {
    local_198 = pIVar6;
    local_1b0 = &pIVar6->ForegroundDrawList;
    if ((window != (ImGuiWindow *)0x0) && (bVar8 = IsItemHovered(0), bVar8)) {
      local_168._4_4_ = (window->Size).y + (window->Pos).y;
      local_168._0_4_ = (window->Size).x + (window->Pos).x;
      ImDrawList::AddRect(local_1b0,&window->Pos,(ImVec2 *)local_168,0xff00ffff,0.0,0xf,1.0);
    }
    if (!bVar7) {
      return;
    }
    if (0 < (draw_list->CmdBuffer).Size) {
      pIVar11 = (draw_list->CmdBuffer).Data;
      iVar16 = 0;
      pIVar18 = pIVar11;
      do {
        if (pIVar18->UserCallback == (ImDrawCallback)0x0) {
          if (pIVar18->ElemCount != 0) {
            if ((draw_list->IdxBuffer).Size < 1) {
              pcVar12 = "non-indexed";
              puVar15 = (unsigned_short *)0x0;
            }
            else {
              puVar15 = (draw_list->IdxBuffer).Data;
              pcVar12 = "indexed";
            }
            cVar9 = TreeNode((void *)(((long)pIVar18 - (long)pIVar11 >> 4) * -0x5555555555555555),
                             "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                             SUB84((double)(pIVar18->ClipRect).x,0),
                             SUB84((double)(pIVar18->ClipRect).y,0),(double)(pIVar18->ClipRect).z,
                             (double)(pIVar18->ClipRect).w,(ulong)pIVar18->ElemCount,pcVar12,
                             pIVar18->TextureId);
            if (show_drawcmd_clip_rects == true) {
              local_1b8 = CONCAT71(local_1b8._1_7_,cVar9);
              bVar7 = IsItemHovered(0);
              this = local_1b0;
              cVar9 = (char)local_1b8;
              if (bVar7) {
                pIVar1 = &pIVar18->ClipRect;
                local_168._0_4_ = pIVar1->x;
                local_168._4_4_ = pIVar1->y;
                local_168._8_4_ = (pIVar18->ClipRect).z;
                fStack_15c = (pIVar18->ClipRect).w;
                local_1d8._0_4_ = 3.4028235e+38;
                local_1d8._4_4_ = 3.4028235e+38;
                local_1d8._8_4_ = -3.4028235e+38;
                fStack_1cc = -3.4028235e+38;
                if (0 < (int)pIVar18->ElemCount) {
                  lVar13 = (long)iVar16;
                  fVar20 = 3.4028235e+38;
                  fVar19 = 3.4028235e+38;
                  fVar22 = -3.4028235e+38;
                  fVar21 = -3.4028235e+38;
                  do {
                    if (puVar15 == (unsigned_short *)0x0) {
                      uVar10 = (uint)lVar13;
                    }
                    else {
                      uVar10 = (uint)puVar15[lVar13];
                    }
                    if ((draw_list->VtxBuffer).Size <= (int)uVar10) {
LAB_0013046a:
                      __assert_fail("i < Size",
                                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.h"
                                    ,0x4d7,
                                    "T &ImVector<ImDrawVert>::operator[](int) [T = ImDrawVert]");
                    }
                    pIVar5 = (draw_list->VtxBuffer).Data;
                    fVar3 = pIVar5[(int)uVar10].pos.x;
                    if (fVar3 < fVar19) {
                      local_1d8._0_4_ = fVar3;
                      fVar19 = fVar3;
                    }
                    pIVar5 = pIVar5 + (int)uVar10;
                    fVar3 = (pIVar5->pos).y;
                    if (fVar3 < fVar20) {
                      local_1d8._4_4_ = fVar3;
                      fVar20 = fVar3;
                    }
                    fVar3 = (pIVar5->pos).x;
                    if (fVar21 < fVar3) {
                      fVar21 = fVar3;
                      local_1d8._8_4_ = fVar3;
                    }
                    fVar3 = (pIVar5->pos).y;
                    if (fVar22 < fVar3) {
                      fVar22 = fVar3;
                      fStack_1cc = fVar3;
                    }
                    lVar13 = lVar13 + 1;
                  } while (lVar13 < (int)(pIVar18->ElemCount + iVar16));
                }
                local_168._8_4_ = (undefined4)(int)(float)local_168._8_4_;
                fStack_15c = (float)(int)fStack_15c;
                local_168._4_4_ = (float)(int)(pIVar18->ClipRect).y;
                local_168._0_4_ = (float)(int)pIVar1->x;
                ImDrawList::AddRect(local_1b0,(ImVec2 *)local_168,(ImVec2 *)(local_168 + 8),
                                    0xff00ffff,0.0,0xf,1.0);
                local_1d8._8_4_ = (undefined4)(int)(float)local_1d8._8_4_;
                fStack_1cc = (float)(int)fStack_1cc;
                local_1d8._4_4_ = (float)(int)(float)local_1d8._4_4_;
                local_1d8._0_4_ = (float)(int)(float)local_1d8._0_4_;
                ImDrawList::AddRect(this,(ImVec2 *)local_1d8,(ImVec2 *)(local_1d8 + 8),0xffff00ff,
                                    0.0,0xf,1.0);
                cVar9 = (char)local_1b8;
              }
            }
            if (cVar9 != '\0') {
              pIVar4 = GImGui->CurrentWindow;
              local_1d8._4_4_ = -1.0;
              local_1d8._0_4_ = ((pIVar4->DC).CursorPos.y - (pIVar4->Pos).y) + (pIVar4->Scroll).y;
              local_1d8._8_4_ = pIVar18->ElemCount / 3;
              fStack_1cc = 0.0;
              uStack_1c8 = 0xffffffff;
              local_1c4 = 0xffffffff;
              local_1bc = iVar16;
              local_1a0 = pIVar18;
              while (bVar7 = ImGuiListClipper::Step((ImGuiListClipper *)local_1d8), bVar7) {
                local_1a4 = local_1c4;
                if ((int)uStack_1c8 < (int)local_1c4) {
                  uVar17 = (ulong)(uStack_1c8 * 3 + local_1bc);
                  uVar10 = uStack_1c8;
                  do {
                    local_1b8 = (ulong)uVar10;
                    local_188[0].x = 0.0;
                    local_188[0].y = 0.0;
                    local_188[1].x = 0.0;
                    local_188[1].y = 0.0;
                    local_188[2].x = 0.0;
                    local_188[2].y = 0.0;
                    lVar13 = 0;
                    pcVar12 = local_168;
                    do {
                      lVar2 = (uVar17 & 0xffffffff) + lVar13;
                      if (puVar15 == (unsigned_short *)0x0) {
                        uVar10 = (uint)lVar2;
                      }
                      else {
                        uVar10 = (uint)puVar15[(int)uVar17 + lVar13];
                      }
                      if ((draw_list->VtxBuffer).Size <= (int)uVar10) goto LAB_0013046a;
                      pIVar5 = (draw_list->VtxBuffer).Data;
                      local_188[lVar13] = pIVar5[(int)uVar10].pos;
                      pcVar14 = "   ";
                      if (lVar13 == 0) {
                        pcVar14 = "idx";
                      }
                      iVar16 = ImFormatString(pcVar12,(size_t)(local_3c + -(long)pcVar12),
                                              "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n"
                                              ,SUB84((double)pIVar5[(int)uVar10].pos.x,0),
                                              SUB84((double)pIVar5[(int)uVar10].pos.y,0),
                                              (double)pIVar5[(int)uVar10].uv.x,
                                              (double)pIVar5[(int)uVar10].uv.y,pcVar14,lVar2,
                                              (ulong)pIVar5[(int)uVar10].col);
                      pcVar12 = pcVar12 + iVar16;
                      lVar13 = lVar13 + 1;
                    } while (lVar13 != 3);
                    local_190.x = 0.0;
                    local_190.y = 0.0;
                    Selectable(local_168,false,0,&local_190);
                    bVar7 = IsItemHovered(0);
                    pIVar6 = local_198;
                    if (bVar7) {
                      uVar10 = (local_198->ForegroundDrawList).Flags;
                      (local_198->ForegroundDrawList).Flags = uVar10 & 0xfffffffe;
                      ImDrawList::AddPolyline(local_1b0,local_188,3,0xff00ffff,true,1.0);
                      (pIVar6->ForegroundDrawList).Flags = uVar10;
                    }
                    uVar17 = (uVar17 & 0xffffffff) + 3;
                    uVar10 = (int)local_1b8 + 1;
                  } while (uVar10 != local_1a4);
                }
              }
              TreePop();
              pIVar18 = local_1a0;
              iVar16 = local_1bc;
              if ((float)local_1d8._8_4_ != -NAN) {
                __assert_fail("ItemsCount == -1",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.h"
                              ,0x6ad,"ImGuiListClipper::~ImGuiListClipper()");
              }
            }
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar18->UserCallback,pIVar18->UserCallbackData);
        }
        iVar16 = iVar16 + pIVar18->ElemCount;
        pIVar18 = pIVar18 + 1;
        pIVar11 = (draw_list->CmdBuffer).Data;
      } while (pIVar18 < pIVar11 + (draw_list->CmdBuffer).Size);
    }
  }
  TreePop();
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }
                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)", pcmd->ElemCount, draw_list->IdxBuffer.Size > 0 ? "indexed" : "non-indexed", pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                if (show_drawcmd_clip_rects && fg_draw_list && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect;
                    for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    clip_rect.Floor(); fg_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,255,0,255));
                    vtxs_rect.Floor(); fg_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,0,255,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char buf[300];
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangles_pos[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            int vtx_i = idx_buffer ? idx_buffer[idx_i] : idx_i;
                            ImDrawVert& v = draw_list->VtxBuffer[vtx_i];
                            triangles_pos[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "idx" : "   ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }
                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }